

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  uint *puVar1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  cpp_dec_float<100U,_int,_void> *pcVar11;
  undefined1 auVar12 [16];
  type_conflict5 tVar13;
  double *pdVar14;
  long lVar15;
  cpp_dec_float<100U,_int,_void> *pcVar16;
  bool bVar17;
  Real val_00;
  ulong uVar18;
  cpp_dec_float<100U,_int,_void> local_288;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<100U,_int,_void> local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  int *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  
  local_288._72_8_ = local_288._72_8_ & 0xffffffff00000000;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[0xc] = 0;
  local_288.data._M_elems[0xd] = 0;
  local_288.data._M_elems._56_5_ = 0;
  local_288.data._M_elems[0xf]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems[6] = 0;
  local_288.data._M_elems[7] = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.data._M_elems[10] = 0;
  local_288.data._M_elems[0xb] = 0;
  local_1d8.fpclass = cpp_dec_float_finite;
  local_1d8.prec_elem = 0x10;
  local_1d8.data._M_elems[0] = 0;
  local_1d8.data._M_elems[1] = 0;
  local_1d8.data._M_elems[2] = 0;
  local_1d8.data._M_elems[3] = 0;
  local_1d8.data._M_elems[4] = 0;
  local_1d8.data._M_elems[5] = 0;
  local_1d8.data._M_elems[6] = 0;
  local_1d8.data._M_elems[7] = 0;
  local_1d8.data._M_elems[8] = 0;
  local_1d8.data._M_elems[9] = 0;
  local_1d8.data._M_elems[10] = 0;
  local_1d8.data._M_elems[0xb] = 0;
  local_1d8.data._M_elems[0xc] = 0;
  local_1d8.data._M_elems[0xd] = 0;
  local_1d8.data._M_elems._56_5_ = 0;
  local_1d8.data._M_elems[0xf]._1_3_ = 0;
  local_1d8.exp = 0;
  local_1d8.neg = false;
  local_e0 = idx;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_2,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val_00 = Tolerances::epsilon((Tolerances *)result_2.m_backend.data._M_elems._0_8_);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val_00,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result_2.m_backend.data._M_elems + 2));
  local_138.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_138.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_138.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_138.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_138.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_138.m_backend.data._M_elems._40_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
  local_138.m_backend.data._M_elems._48_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
  local_138.m_backend.data._M_elems._56_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
  local_138.m_backend.exp = (val->m_backend).exp;
  local_138.m_backend.neg = (val->m_backend).neg;
  local_138.m_backend.fpclass = (val->m_backend).fpclass;
  local_138.m_backend.prec_elem = (val->m_backend).prec_elem;
  local_e8 = val;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_1d8,0);
  v = &(this->
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).delta;
  lVar15 = (long)num;
LAB_003773e0:
  do {
    bVar17 = lVar15 == 0;
    lVar15 = lVar15 + -1;
    if (bVar17) {
      *(undefined8 *)((local_e8->m_backend).data._M_elems + 0xc) =
           local_138.m_backend.data._M_elems._48_8_;
      *(undefined8 *)((local_e8->m_backend).data._M_elems + 0xe) =
           local_138.m_backend.data._M_elems._56_8_;
      *(undefined8 *)((local_e8->m_backend).data._M_elems + 8) =
           local_138.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((local_e8->m_backend).data._M_elems + 10) =
           local_138.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((local_e8->m_backend).data._M_elems + 4) =
           local_138.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((local_e8->m_backend).data._M_elems + 6) =
           local_138.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(local_e8->m_backend).data._M_elems = local_138.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((local_e8->m_backend).data._M_elems + 2) =
           local_138.m_backend.data._M_elems._8_8_;
      (local_e8->m_backend).exp = local_138.m_backend.exp;
      (local_e8->m_backend).neg = local_138.m_backend.neg;
      (local_e8->m_backend).fpclass = local_138.m_backend.fpclass;
      (local_e8->m_backend).prec_elem = local_138.m_backend.prec_elem;
      return -1;
    }
    iVar2 = local_e0[lVar15];
    uVar3 = *(undefined8 *)upd[iVar2].m_backend.data._M_elems;
    uVar4 = *(undefined8 *)(upd[iVar2].m_backend.data._M_elems + 2);
    puVar1 = upd[iVar2].m_backend.data._M_elems + 4;
    uVar5 = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    puVar1 = upd[iVar2].m_backend.data._M_elems + 8;
    uVar7 = *(undefined8 *)puVar1;
    uVar8 = *(undefined8 *)(puVar1 + 2);
    puVar1 = upd[iVar2].m_backend.data._M_elems + 0xc;
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    local_288.data._M_elems[0xc] = (uint)uVar9;
    local_288.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
    local_288.data._M_elems._56_5_ = SUB85(uVar10,0);
    local_288.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
    local_288.data._M_elems[8] = (uint)uVar7;
    local_288.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
    local_288.data._M_elems[10] = (uint)uVar8;
    local_288.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
    local_288.data._M_elems[4] = (uint)uVar5;
    local_288.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
    local_288.data._M_elems[6] = (uint)uVar6;
    local_288.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
    local_288.data._M_elems[0] = (uint)uVar3;
    local_288.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
    local_288.data._M_elems[2] = (uint)uVar4;
    local_288.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
    local_288.exp = upd[iVar2].m_backend.exp;
    local_288.neg = upd[iVar2].m_backend.neg;
    local_288.fpclass = upd[iVar2].m_backend.fpclass;
    local_288.prec_elem = upd[iVar2].m_backend.prec_elem;
    tVar13 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_288,&epsilon);
    if (!tVar13) goto LAB_003776a0;
    tVar13 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_288,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1d8);
    pcVar16 = &local_1d8;
    if (tVar13) {
      pcVar16 = &local_288;
    }
    uVar3 = *(undefined8 *)(pcVar16->data)._M_elems;
    uVar4 = *(undefined8 *)((pcVar16->data)._M_elems + 2);
    uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 4);
    uVar6 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
    uVar7 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
    uVar8 = *(undefined8 *)((pcVar16->data)._M_elems + 10);
    uVar9 = *(undefined8 *)((pcVar16->data)._M_elems + 0xc);
    uVar10 = *(undefined8 *)((pcVar16->data)._M_elems + 0xe);
    local_1d8.data._M_elems[0xc] = (uint)uVar9;
    local_1d8.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
    local_1d8.data._M_elems._56_5_ = SUB85(uVar10,0);
    local_1d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
    local_1d8.data._M_elems[8] = (uint)uVar7;
    local_1d8.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
    local_1d8.data._M_elems[10] = (uint)uVar8;
    local_1d8.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
    local_1d8.data._M_elems[4] = (uint)uVar5;
    local_1d8.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
    local_1d8.data._M_elems[6] = (uint)uVar6;
    local_1d8.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
    local_1d8.data._M_elems[0] = (uint)uVar3;
    local_1d8.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
    local_1d8.data._M_elems[2] = (uint)uVar4;
    local_1d8.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
    pcVar16 = &local_1d8;
    if (tVar13) {
      pcVar16 = &local_288;
    }
    pcVar11 = &local_1d8;
    if (tVar13) {
      pcVar11 = &local_288;
    }
    local_1d8.exp = pcVar16->exp;
    local_1d8.neg = pcVar11->neg;
    uVar18 = CONCAT44((int)((uint)tVar13 << 0x1f) >> 0x1f,(int)((uint)tVar13 << 0x1f) >> 0x1f);
    local_1d8._72_8_ = ~uVar18 & local_1d8._72_8_ | local_288._72_8_ & uVar18;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems._56_5_ = 0;
    result.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result.m_backend,&low[iVar2].m_backend,&vec[iVar2].m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_1.m_backend,&result.m_backend,&v->m_backend);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems[8] = 0;
    result_2.m_backend.data._M_elems[9] = 0;
    result_2.m_backend.data._M_elems[10] = 0;
    result_2.m_backend.data._M_elems[0xb] = 0;
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems._56_5_ = 0;
    result_2.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_2.m_backend,&result_1.m_backend,&local_288);
    local_288.data._M_elems[0xc] = result_2.m_backend.data._M_elems[0xc];
    local_288.data._M_elems[0xd] = result_2.m_backend.data._M_elems[0xd];
    local_288.data._M_elems._56_5_ = result_2.m_backend.data._M_elems._56_5_;
    local_288.data._M_elems[0xf]._1_3_ = result_2.m_backend.data._M_elems[0xf]._1_3_;
    local_288.data._M_elems[8] = result_2.m_backend.data._M_elems[8];
    local_288.data._M_elems[9] = result_2.m_backend.data._M_elems[9];
    local_288.data._M_elems[10] = result_2.m_backend.data._M_elems[10];
    local_288.data._M_elems[0xb] = result_2.m_backend.data._M_elems[0xb];
    local_288.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
    local_288.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
    local_288.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
    local_288.data._M_elems[7] = result_2.m_backend.data._M_elems[7];
    local_288.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
    local_288.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
    local_288.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
    local_288.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
    local_288.exp = result_2.m_backend.exp;
    local_288.neg = result_2.m_backend.neg;
    local_288.fpclass = result_2.m_backend.fpclass;
    local_288.prec_elem = result_2.m_backend.prec_elem;
    tVar13 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_288,&local_138);
  } while (!tVar13);
  pdVar14 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&result_2.m_backend,-*pdVar14,(type *)0x0);
  tVar13 = boost::multiprecision::operator>
                     ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&low[iVar2].m_backend,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result_2.m_backend);
  goto LAB_00377a17;
LAB_003776a0:
  result_2.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
  result_2.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
  result_2.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  result_2.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
  auVar12 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
  result_2.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
  result_2.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
  result_2.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
  result_2.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
  result_2.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
  result_2.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
  result_2.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
  result_2.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
  result_2.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
  result_2.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
  result_2.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
  result_2.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
  result_2.m_backend.exp = epsilon.m_backend.exp;
  result_2.m_backend.neg = epsilon.m_backend.neg;
  result_2.m_backend.fpclass = epsilon.m_backend.fpclass;
  result_2.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  result_2.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  if (epsilon.m_backend.fpclass != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0)
  {
    result_2.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
  }
  result_2.m_backend.data._M_elems._0_16_ = auVar12;
  tVar13 = boost::multiprecision::operator<
                     ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_288,&result_2);
  if (tVar13) {
    result_2.m_backend.data._M_elems[1] = local_288.data._M_elems[1];
    result_2.m_backend.data._M_elems[0] = local_288.data._M_elems[0];
    result_2.m_backend.data._M_elems[3] = local_288.data._M_elems[3];
    result_2.m_backend.data._M_elems[2] = local_288.data._M_elems[2];
    result_2.m_backend.data._M_elems[5] = local_288.data._M_elems[5];
    result_2.m_backend.data._M_elems[4] = local_288.data._M_elems[4];
    result_2.m_backend.data._M_elems[7] = local_288.data._M_elems[7];
    result_2.m_backend.data._M_elems[6] = local_288.data._M_elems[6];
    result_2.m_backend.data._M_elems[9] = local_288.data._M_elems[9];
    result_2.m_backend.data._M_elems[8] = local_288.data._M_elems[8];
    result_2.m_backend.data._M_elems[0xb] = local_288.data._M_elems[0xb];
    result_2.m_backend.data._M_elems[10] = local_288.data._M_elems[10];
    result_2.m_backend.data._M_elems[0xd] = local_288.data._M_elems[0xd];
    result_2.m_backend.data._M_elems[0xc] = local_288.data._M_elems[0xc];
    result_2.m_backend.data._M_elems._56_5_ = local_288.data._M_elems._56_5_;
    result_2.m_backend.data._M_elems[0xf]._1_3_ = local_288.data._M_elems[0xf]._1_3_;
    result_2.m_backend.exp = local_288.exp;
    result_2.m_backend.neg = local_288.neg;
    result_2.m_backend.fpclass = local_288.fpclass;
    result_2.m_backend.prec_elem = local_288.prec_elem;
    if (local_288.fpclass != 0 || local_288.data._M_elems[0] != 0) {
      result_2.m_backend.neg = (bool)(local_288.neg ^ 1);
    }
    tVar13 = boost::multiprecision::operator>
                       (&result_2,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1d8);
    if (tVar13) {
      result_1.m_backend.data._M_elems[0] = local_288.data._M_elems[1];
      result_1.m_backend.data._M_elems[1] = local_288.data._M_elems[2];
      result_1.m_backend.data._M_elems[2] = local_288.data._M_elems[3];
      result_1.m_backend.data._M_elems[3] = local_288.data._M_elems[4];
      result_1.m_backend.data._M_elems[4] = local_288.data._M_elems[5];
      result_1.m_backend.data._M_elems[5] = local_288.data._M_elems[6];
      result_1.m_backend.data._M_elems[6] = local_288.data._M_elems[7];
      result_1.m_backend.data._M_elems[7] = local_288.data._M_elems[8];
      result_1.m_backend.data._M_elems[8] = local_288.data._M_elems[9];
      result_1.m_backend.data._M_elems[9] = local_288.data._M_elems[10];
      result_1.m_backend.data._M_elems[10] = local_288.data._M_elems[0xb];
      result_1.m_backend.data._M_elems[0xb] = local_288.data._M_elems[0xc];
      result_1.m_backend.data._M_elems[0xc] = local_288.data._M_elems[0xd];
      result_1.m_backend.data._M_elems[0xd] = local_288.data._M_elems[0xe];
      result_1.m_backend.data._M_elems[0xe] =
           (uint)(CONCAT35(local_288.data._M_elems[0xf]._1_3_,local_288.data._M_elems._56_5_) >>
                 0x20);
      local_1d8.exp = local_288.exp;
      local_1d8.prec_elem = local_288.prec_elem;
      if (local_288.fpclass == cpp_dec_float_finite && local_288.data._M_elems[0] == 0) {
        local_1d8.neg = local_288.neg;
        local_1d8.fpclass = cpp_dec_float_finite;
        local_1d8.data._M_elems[0] = 0;
      }
      else {
        local_1d8.neg = (bool)(local_288.neg ^ 1);
        local_1d8.fpclass = local_288.fpclass;
        local_1d8.data._M_elems[0] = local_288.data._M_elems[0];
      }
    }
    else {
      result_1.m_backend.data._M_elems[0] = local_1d8.data._M_elems[1];
      result_1.m_backend.data._M_elems[1] = local_1d8.data._M_elems[2];
      result_1.m_backend.data._M_elems[2] = local_1d8.data._M_elems[3];
      result_1.m_backend.data._M_elems[3] = local_1d8.data._M_elems[4];
      result_1.m_backend.data._M_elems[4] = local_1d8.data._M_elems[5];
      result_1.m_backend.data._M_elems[5] = local_1d8.data._M_elems[6];
      result_1.m_backend.data._M_elems[6] = local_1d8.data._M_elems[7];
      result_1.m_backend.data._M_elems[7] = local_1d8.data._M_elems[8];
      result_1.m_backend.data._M_elems[8] = local_1d8.data._M_elems[9];
      result_1.m_backend.data._M_elems[9] = local_1d8.data._M_elems[10];
      result_1.m_backend.data._M_elems[10] = local_1d8.data._M_elems[0xb];
      result_1.m_backend.data._M_elems[0xb] = local_1d8.data._M_elems[0xc];
      result_1.m_backend.data._M_elems[0xc] = local_1d8.data._M_elems[0xd];
      result_1.m_backend.data._M_elems[0xd] = local_1d8.data._M_elems[0xe];
      result_1.m_backend.data._M_elems[0xe] =
           (uint)(CONCAT35(local_1d8.data._M_elems[0xf]._1_3_,local_1d8.data._M_elems._56_5_) >>
                 0x20);
    }
    local_1d8.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xc];
    local_1d8.data._M_elems._56_5_ =
         SUB85(CONCAT44(result_1.m_backend.data._M_elems[0xe],result_1.m_backend.data._M_elems[0xd])
               ,0);
    local_1d8.data._M_elems[0xf]._1_3_ = (undefined3)(result_1.m_backend.data._M_elems[0xe] >> 8);
    local_1d8.data._M_elems[9] = result_1.m_backend.data._M_elems[8];
    local_1d8.data._M_elems[10] = result_1.m_backend.data._M_elems[9];
    local_1d8.data._M_elems[0xb] = result_1.m_backend.data._M_elems[10];
    local_1d8.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xb];
    local_1d8.data._M_elems[5] = result_1.m_backend.data._M_elems[4];
    local_1d8.data._M_elems[6] = result_1.m_backend.data._M_elems[5];
    local_1d8.data._M_elems[7] = result_1.m_backend.data._M_elems[6];
    local_1d8.data._M_elems[8] = result_1.m_backend.data._M_elems[7];
    local_1d8.data._M_elems[1] = result_1.m_backend.data._M_elems[0];
    local_1d8.data._M_elems[2] = result_1.m_backend.data._M_elems[1];
    local_1d8.data._M_elems[3] = result_1.m_backend.data._M_elems[2];
    local_1d8.data._M_elems[4] = result_1.m_backend.data._M_elems[3];
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x10;
    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems._56_5_ = 0;
    result.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result.m_backend,&up[iVar2].m_backend,&vec[iVar2].m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x10;
    result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_1.m_backend,&result.m_backend,&v->m_backend);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems._56_5_ = 0;
    result_2.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_2.m_backend,&result_1.m_backend,&local_288);
    local_288.data._M_elems[0xc] = result_2.m_backend.data._M_elems[0xc];
    local_288.data._M_elems[0xd] = result_2.m_backend.data._M_elems[0xd];
    local_288.data._M_elems._56_5_ = result_2.m_backend.data._M_elems._56_5_;
    local_288.data._M_elems[0xf]._1_3_ = result_2.m_backend.data._M_elems[0xf]._1_3_;
    local_288.data._M_elems[8] = result_2.m_backend.data._M_elems[8];
    local_288.data._M_elems[9] = result_2.m_backend.data._M_elems[9];
    local_288.data._M_elems[10] = result_2.m_backend.data._M_elems[10];
    local_288.data._M_elems[0xb] = result_2.m_backend.data._M_elems[0xb];
    local_288.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
    local_288.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
    local_288.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
    local_288.data._M_elems[7] = result_2.m_backend.data._M_elems[7];
    local_288.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
    local_288.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
    local_288.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
    local_288.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
    local_288.exp = result_2.m_backend.exp;
    local_288.neg = result_2.m_backend.neg;
    local_288.fpclass = result_2.m_backend.fpclass;
    local_288.prec_elem = result_2.m_backend.prec_elem;
    tVar13 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_288,&local_138);
    if (tVar13) {
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&result_2.m_backend,*pdVar14,(type *)0x0);
      tVar13 = boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&up[iVar2].m_backend,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result_2.m_backend);
LAB_00377a17:
      if (tVar13 != false) {
        local_138.m_backend.data._M_elems[1] = local_288.data._M_elems[1];
        local_138.m_backend.data._M_elems[0] = local_288.data._M_elems[0];
        local_138.m_backend.data._M_elems[3] = local_288.data._M_elems[3];
        local_138.m_backend.data._M_elems[2] = local_288.data._M_elems[2];
        local_138.m_backend.data._M_elems[5] = local_288.data._M_elems[5];
        local_138.m_backend.data._M_elems[4] = local_288.data._M_elems[4];
        local_138.m_backend.data._M_elems[7] = local_288.data._M_elems[7];
        local_138.m_backend.data._M_elems[6] = local_288.data._M_elems[6];
        local_138.m_backend.data._M_elems[9] = local_288.data._M_elems[9];
        local_138.m_backend.data._M_elems[8] = local_288.data._M_elems[8];
        local_138.m_backend.data._M_elems[0xb] = local_288.data._M_elems[0xb];
        local_138.m_backend.data._M_elems[10] = local_288.data._M_elems[10];
        local_138.m_backend.data._M_elems[0xd] = local_288.data._M_elems[0xd];
        local_138.m_backend.data._M_elems[0xc] = local_288.data._M_elems[0xc];
        local_138.m_backend.data._M_elems[0xf]._1_3_ = local_288.data._M_elems[0xf]._1_3_;
        local_138.m_backend.data._M_elems._56_5_ = local_288.data._M_elems._56_5_;
        local_138.m_backend.exp = local_288.exp;
        local_138.m_backend.neg = local_288.neg;
        local_138.m_backend.fpclass = local_288.fpclass;
        local_138.m_backend.prec_elem = local_288.prec_elem;
      }
    }
  }
  goto LAB_003773e0;
}

Assistant:

int SPxHarrisRT<R>::minDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
) const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val < 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x > theval && low[i] > R(-infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x > theval && up[i] < R(infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}